

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

Clifford * operator*(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  uint uVar1;
  pointer pBVar2;
  pointer pBVar3;
  float *pfVar4;
  int iVar5;
  pointer pBVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pBVar9;
  long lVar10;
  uint uVar11;
  float fVar12;
  Blade BStack_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pfVar4 = Re;
  iVar5 = dim;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < dim) {
    uVar8 = (ulong)(uint)dim;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    pfVar4[uVar7] = 0.0;
  }
  pBVar2 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pBVar6 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_start; pfVar4 = Re, pBVar6 != pBVar2; pBVar6 = pBVar6 + 1
      ) {
    uVar1 = pBVar6->mBase;
    pBVar3 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (pBVar9 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                  super__Vector_impl_data._M_start; pBVar9 != pBVar3; pBVar9 = pBVar9 + 1) {
      fVar12 = pBVar6->mVal * pBVar9->mVal;
      if (1e-06 < ABS(fVar12)) {
        uVar11 = pBVar9->mBase ^ uVar1;
        pfVar4[(int)uVar11] = (float)signs[(int)uVar1][pBVar9->mBase] * fVar12 + pfVar4[(int)uVar11]
        ;
      }
    }
  }
  for (lVar10 = 0; lVar10 < iVar5; lVar10 = lVar10 + 1) {
    if (1e-06 < ABS(Re[lVar10])) {
      Blade::Blade(&BStack_38,(int)lVar10,Re[lVar10]);
      std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                (__return_storage_ptr__,&BStack_38);
      Blade::~Blade(&BStack_38);
      iVar5 = dim;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator*(Clifford A, Clifford B)
{
    Clifford R; 
	for(int i=0;i<dim;i++)Re[i]=0;

    idx a=A.begin();
	while(a!=A.end())
	{	
		int am=a->mBase;
		idx b=B.begin();
		while(b!=B.end())
		{	
			int bm=b->mBase;
			float prd=(a->mVal)*(b->mVal);
			if(fabs(prd)>Error2)
			{
				Re[am^bm]+=signs[am][bm]*prd;
			}
			b++;
		}
		a++;
	}

    
	for(int i=0;i<dim;i++)
	{if(fabs(Re[i])>Error2){R.push_back(Blade(i,Re[i]));}}
	
	//delete Re;
	return R;
}